

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O2

Uint64 __thiscall
Diligent::CommandQueueVkImpl::BindSparse(CommandQueueVkImpl *this,VkBindSparseInfo *InBindInfo)

{
  atomic<unsigned_long> *paVar1;
  Uint64 Value;
  SoftwareQueueIndex CommandQueueId;
  pointer ppVVar2;
  undefined4 uVar3;
  VkResult VVar4;
  VkBindSparseInfo *pVVar5;
  uint32_t s;
  ulong uVar6;
  long lVar7;
  FenceVkImpl *this_00;
  byte bVar8;
  SyncPointVkPtr NewSyncPoint;
  string msg_1;
  __shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2> local_a0;
  string msg;
  
  bVar8 = 0;
  std::mutex::lock(&this->m_QueueMutex);
  LOCK();
  paVar1 = &this->m_NextFenceValue;
  Value = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  CreateSyncPoint((CommandQueueVkImpl *)&NewSyncPoint,(Uint64)this);
  ppVVar2 = (this->m_TempSignalSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_TempSignalSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar2) {
    (this->m_TempSignalSemaphores).
    super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVVar2;
  }
  SyncPointVk::GetSemaphores
            (NewSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,&this->m_TempSignalSemaphores);
  pVVar5 = InBindInfo;
  do {
    pVVar5 = (VkBindSparseInfo *)pVVar5->pNext;
    if (pVVar5 == (VkBindSparseInfo *)0x0) goto LAB_002708f6;
  } while (pVVar5->sType != VK_STRUCTURE_TYPE_TIMELINE_SEMAPHORE_SUBMIT_INFO);
  if ((this->m_TempSignalSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->m_TempSignalSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    FormatString<char[60]>
              (&msg,(char (*) [60])"Can not append semaphores when timeline semaphores are used");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BindSparse",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0x137);
    std::__cxx11::string::~string((string *)&msg);
  }
LAB_002708f6:
  lVar7 = 0;
  for (uVar6 = 0; uVar6 < InBindInfo->signalSemaphoreCount; uVar6 = uVar6 + 1) {
    std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::push_back
              (&this->m_TempSignalSemaphores,
               (value_type *)((long)InBindInfo->pSignalSemaphores + lVar7));
    lVar7 = lVar7 + 8;
  }
  pVVar5 = (VkBindSparseInfo *)&msg;
  for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
    uVar3 = *(undefined4 *)&InBindInfo->field_0x4;
    pVVar5->sType = InBindInfo->sType;
    *(undefined4 *)&pVVar5->field_0x4 = uVar3;
    InBindInfo = (VkBindSparseInfo *)((long)InBindInfo + (ulong)bVar8 * -0x10 + 8);
    pVVar5 = (VkBindSparseInfo *)((long)pVVar5 + (ulong)bVar8 * -0x10 + 8);
  }
  VVar4 = (*vkQueueBindSparse)
                    (this->m_VkQueue,1,(VkBindSparseInfo *)&msg,
                     ((NewSyncPoint.
                       super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->m_Fence).m_VkSyncObject);
  if (VVar4 != VK_SUCCESS) {
    FormatString<char[59]>
              (&msg_1,(char (*) [59])"Failed to submit sparse bind commands to the command queue");
    DebugAssertionFailed
              (msg_1._M_dataplus._M_p,"BindSparse",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0x146);
    std::__cxx11::string::~string((string *)&msg_1);
  }
  this_00 = (this->m_pFence).m_pObject;
  if (this_00 == (FenceVkImpl *)0x0) {
    FormatString<char[45]>(&msg_1,(char (*) [45])"Command queue fence has not been initialized");
    DebugAssertionFailed
              (msg_1._M_dataplus._M_p,"BindSparse",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0x149);
    std::__cxx11::string::~string((string *)&msg_1);
    this_00 = (this->m_pFence).m_pObject;
  }
  CommandQueueId.m_Value = (this->m_CommandQueueId).m_Value;
  std::__shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a0,
             &NewSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>);
  FenceVkImpl::AddPendingSyncPoint(this_00,CommandQueueId,Value,(SyncPointVkPtr *)&local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
  Threading::SpinLock::lock(&this->m_LastSyncPointLock);
  std::__shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_LastSyncPoint).
              super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>,
             &NewSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>);
  Threading::SpinLock::unlock(&this->m_LastSyncPointLock);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&NewSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_QueueMutex);
  return Value;
}

Assistant:

Uint64 CommandQueueVkImpl::BindSparse(const VkBindSparseInfo& InBindInfo)
{
    std::lock_guard<std::mutex> QueueGuard{m_QueueMutex};

    // Increment the value before submitting the buffer to be overly safe
    const uint64_t FenceValue = m_NextFenceValue.fetch_add(1);

    auto NewSyncPoint = CreateSyncPoint(FenceValue);

    m_TempSignalSemaphores.clear();
    NewSyncPoint->GetSemaphores(m_TempSignalSemaphores);

#ifdef DILIGENT_DEBUG
    const VkBaseInStructure* pStruct = static_cast<const VkBaseInStructure*>(InBindInfo.pNext);
    for (; pStruct != nullptr;)
    {
        if (pStruct->sType == VK_STRUCTURE_TYPE_TIMELINE_SEMAPHORE_SUBMIT_INFO)
        {
            VERIFY(m_TempSignalSemaphores.empty(), "Can not append semaphores when timeline semaphores are used");
            break;
        }
        pStruct = pStruct->pNext;
    }
#endif

    for (uint32_t s = 0; s < InBindInfo.signalSemaphoreCount; ++s)
        m_TempSignalSemaphores.push_back(InBindInfo.pSignalSemaphores[s]);

    VkBindSparseInfo BindInfo     = InBindInfo;
    BindInfo.signalSemaphoreCount = static_cast<Uint32>(m_TempSignalSemaphores.size());
    BindInfo.pSignalSemaphores    = m_TempSignalSemaphores.data();

    auto err = vkQueueBindSparse(m_VkQueue, 1, &BindInfo, NewSyncPoint->GetFence());
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to submit sparse bind commands to the command queue");
    (void)err;

    VERIFY(m_pFence != nullptr, "Command queue fence has not been initialized");
    m_pFence->AddPendingSyncPoint(m_CommandQueueId, FenceValue, NewSyncPoint);

    // Update the last sync point
    {
        Threading::SpinLockGuard SyncPointGuard{m_LastSyncPointLock};
        m_LastSyncPoint = std::move(NewSyncPoint);
    }

    return FenceValue;
}